

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

unsigned_fast_type
math::wide_integer::lsb<128u,unsigned_short,void,false>
          (uintwide_t<128U,_unsigned_short,_void,_false> *x)

{
  ushort uVar1;
  unsigned_short uVar2;
  array<unsigned_short,_8UL> *paVar3;
  const_iterator puVar4;
  unsigned_fast_type uVar5;
  const_iterator puStack_28;
  local_value_type vi;
  const_iterator it;
  unsigned_fast_type offset;
  unsigned_fast_type bpos;
  uintwide_t<128U,_unsigned_short,_void,_false> *x_local;
  
  it = (const_iterator)0x0;
  paVar3 = &uintwide_t<128U,_unsigned_short,_void,_false>::crepresentation(x)->
            super_array<unsigned_short,_8UL>;
  puStack_28 = detail::array_detail::array<unsigned_short,_8UL>::cbegin(paVar3);
  while( true ) {
    paVar3 = &uintwide_t<128U,_unsigned_short,_void,_false>::crepresentation(x)->
              super_array<unsigned_short,_8UL>;
    puVar4 = detail::array_detail::array<unsigned_short,_8UL>::cend(paVar3);
    if (puStack_28 == puVar4) {
      return 0;
    }
    uVar1 = *puStack_28;
    uVar2 = std::numeric_limits<unsigned_short>::max();
    if ((uVar1 & uVar2) != 0) break;
    puStack_28 = puStack_28 + 1;
    it = (const_iterator)((long)it + 1);
  }
  uVar5 = detail::lsb_helper<unsigned_short>(puStack_28);
  return uVar5 + (long)it * 0x10;
}

Assistant:

constexpr auto lsb(const uintwide_t<Width2, LimbType, AllocatorType, IsSigned>& x) -> unsigned_fast_type
  {
    // Calculate the position of the least-significant bit.
    // Use a linear search starting from the least significant limb.

    using local_wide_integer_type = uintwide_t<Width2, LimbType, AllocatorType, IsSigned>;
    using local_value_type        = typename local_wide_integer_type::representation_type::value_type;

    auto bpos   = static_cast<unsigned_fast_type>(UINT8_C(0));
    auto offset = static_cast<unsigned_fast_type>(UINT8_C(0));

    for(auto it = x.crepresentation().cbegin(); it != x.crepresentation().cend(); ++it, ++offset) // NOLINT(llvm-qualified-auto,readability-qualified-auto,altera-id-dependent-backward-branch)
    {
      const auto vi = static_cast<local_value_type>(*it & (std::numeric_limits<local_value_type>::max)());

      if(vi != static_cast<local_value_type>(UINT8_C(0)))
      {
        bpos =
          static_cast<unsigned_fast_type>
          (
              detail::lsb_helper(*it)
            + static_cast<unsigned_fast_type>
              (
                static_cast<unsigned_fast_type>(std::numeric_limits<local_value_type>::digits) * offset
              )
          );

        break;
      }
    }

    return bpos;
  }